

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void Print<std::forward_list<int,std::allocator<int>>>(forward_list<int,_std::allocator<int>_> *d)

{
  _Fwd_list_node_base *p_Var1;
  ostream *poVar2;
  
  for (p_Var1 = (d->super__Fwd_list_base<int,_std::allocator<int>_>)._M_impl._M_head._M_next;
      p_Var1 != (_Fwd_list_node_base *)0x0; p_Var1 = p_Var1->_M_next) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*(int *)&p_Var1[1]._M_next);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  return;
}

Assistant:

void Print(T &d)
{
    for(auto &&e : d)
    {
        cout << e << ",";
    }

    cout << endl;
}